

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayNewData
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,Name data)

{
  ArrayNewData *pAVar1;
  bool bVar2;
  Ok local_e1;
  size_t local_e0;
  char *local_d8;
  uintptr_t local_d0;
  uint local_c4;
  Err local_c0;
  Err *local_90;
  Err *err;
  Result<wasm::Ok> _val;
  ArrayNewData curr;
  IRBuilder *this_local;
  Name data_local;
  HeapType type_local;
  
  pAVar1 = (ArrayNewData *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  ArrayNewData::ArrayNewData(pAVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitArrayNewData
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pAVar1);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_90 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_c0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  local_c4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_c4 == 0) {
    local_e0 = data.super_IString.str._M_len;
    local_d8 = data.super_IString.str._M_str;
    local_d0 = type.id;
    pAVar1 = Builder::makeArrayNewData
                       (&this->builder,type,data,(Expression *)curr.segment.super_IString.str._M_str
                        ,curr.offset);
    push(this,(Expression *)pAVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_e1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayNewData(HeapType type, Name data) {
  ArrayNewData curr;
  CHECK_ERR(visitArrayNewData(&curr));
  push(builder.makeArrayNewData(type, data, curr.offset, curr.size));
  return Ok{};
}